

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double __thiscall ON_PlaneEquation::operator[](ON_PlaneEquation *this,uint i)

{
  switch(i) {
  case 0:
    return this->x;
  case 1:
    return this->y;
  case 2:
    return this->z;
  case 3:
    return this->d;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_point.cpp"
               ,0x1b93,"","Invalid coefficient index.");
    return -1.23432101234321e+308;
  }
}

Assistant:

double ON_PlaneEquation::operator[](unsigned int i) const
{
  switch (i)
  {
  case 0:
    return x;
    break;
  case 1:
    return y;
    break;
  case 2:
    return z;
    break;
  case 3:
    return d;
    break;
  }

  ON_ERROR("Invalid coefficient index.");
  return ON_UNSET_VALUE;
}